

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QDateTimeParser::SectionNode,QDateTimeParser::SectionNode>
                    (QList<QDateTimeParser::SectionNode> *vector,SectionNode *u,qsizetype from)

{
  undefined4 uVar1;
  ulong uVar2;
  SectionNode *pSVar3;
  undefined4 uVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  qsizetype qVar11;
  SectionNode SVar12;
  
  uVar2 = (vector->d).size;
  uVar7 = from;
  if (from < 0) {
    uVar7 = from + uVar2;
    if ((long)(from + uVar2) < 1) {
      uVar7 = 0;
    }
  }
  qVar11 = -1;
  if (uVar7 < uVar2) {
    pSVar3 = (vector->d).ptr;
    piVar8 = &pSVar3[uVar7].count;
    lVar9 = uVar2 * 0x10 + uVar7 * -0x10;
    lVar5 = 0x10 - (long)(pSVar3 + uVar7);
    do {
      lVar10 = lVar5;
      if (lVar9 == 0) {
        return -1;
      }
      uVar1 = ((SectionNode *)(piVar8 + -2))->type;
      uVar4 = ((SectionNode *)(piVar8 + -2))->pos;
      SVar12.pos = uVar4;
      SVar12.type = uVar1;
      SVar12._8_8_ = *(undefined8 *)piVar8;
      cVar6 = ::operator==(SVar12,*u);
      piVar8 = piVar8 + 4;
      lVar9 = lVar9 + -0x10;
      lVar5 = lVar10 + -0x10;
    } while (cVar6 == '\0');
    qVar11 = -((long)&(vector->d).ptr[-1].type + lVar10) >> 4;
  }
  return qVar11;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}